

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::SimpleNode::Print(SimpleNode *this,DebugWriter *w,Char *litbuf)

{
  NodeTag NVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Char *litbuf_local;
  DebugWriter *w_local;
  SimpleNode *this_local;
  
  NVar1 = (this->super_Node).tag;
  if (NVar1 == Empty) {
    DebugWriter::Print(w,L"Empty");
  }
  else if (NVar1 == BOL) {
    DebugWriter::Print(w,L"BOL");
  }
  else if (NVar1 == EOL) {
    DebugWriter::Print(w,L"EOL");
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x274,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  DebugWriter::PrintEOL(w,L"()");
  Node::PrintAnnotations(&this->super_Node,w);
  return;
}

Assistant:

void SimpleNode::Print(DebugWriter* w, const Char* litbuf) const
    {
        switch (tag)
        {
        case Empty:
            w->Print(_u("Empty")); break;
        case BOL:
            w->Print(_u("BOL")); break;
        case EOL:
            w->Print(_u("EOL")); break;
        default:
            Assert(false);
        }
        w->PrintEOL(_u("()"));
        PrintAnnotations(w);
    }